

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

bool leveldb::Version::RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
     FileMetaData__(void *arg,int level,FileMetaData *f)

{
  int iVar1;
  
  iVar1 = *(int *)((long)arg + 0x10);
  *(int *)((long)arg + 0x10) = iVar1 + 1;
  if (iVar1 == 0) {
    *(FileMetaData **)arg = f;
    *(int *)((long)arg + 8) = level;
  }
  return iVar1 < 1;
}

Assistant:

static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }